

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O1

void handle_flush_reconfig(EVmaster master,EVmaster_msg_ptr mmsg)

{
  EVdfg p_Var1;
  FILE *__stream;
  EVdfg_stone_state p_Var2;
  int iVar3;
  __pid_t _Var4;
  pthread_t pVar5;
  attr_list p_Var6;
  long lVar7;
  long lVar8;
  timespec ts;
  timespec local_40;
  
  p_Var1 = master->dfg;
  iVar3 = CManager_locked(master->cm);
  if (iVar3 == 0) {
    __assert_fail("CManager_locked(master->cm)",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                  ,0x4ac,"void handle_flush_reconfig(EVmaster, EVmaster_msg_ptr)");
  }
  if ((mmsg->u).flush_reconfig.reconfig != 0) {
    master->state = DFG_Reconfiguring;
  }
  iVar3 = CMtrace_val[0xd];
  if (master->cm->CMTrace_file == (FILE *)0x0) {
    iVar3 = CMtrace_init(master->cm,EVdfgVerbose);
  }
  if (iVar3 != 0) {
    if (CMtrace_PID != 0) {
      __stream = (FILE *)master->cm->CMTrace_file;
      _Var4 = getpid();
      pVar5 = pthread_self();
      fprintf(__stream,"P%lxT%lx - ",(long)_Var4,pVar5);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_40);
      fprintf((FILE *)master->cm->CMTrace_file,"%lld.%.9ld - ",local_40.tv_sec,local_40.tv_nsec);
    }
    fprintf((FILE *)master->cm->CMTrace_file,
            "EVDFG flush_attr_reconfig -  master DFG state is now %s\n",str_state[master->state]);
  }
  fflush((FILE *)master->cm->CMTrace_file);
  if (0 < (mmsg->u).flush_reconfig.count) {
    lVar8 = 0;
    do {
      if (0 < (long)p_Var1->stone_count) {
        lVar7 = 0;
        do {
          p_Var2 = p_Var1->deployed_state->stones[lVar7];
          if ((mmsg->u).flush_reconfig.attr_stone_list[lVar8].stone == (long)p_Var2->stone_id) {
            if (p_Var2->attrs != (attr_list)0x0) {
              free_attr_list();
            }
            p_Var6 = (attr_list)
                     attr_list_from_string((mmsg->u).flush_reconfig.attr_stone_list[lVar8].attr_str)
            ;
            p_Var1->deployed_state->stones[lVar7]->attrs = p_Var6;
            if (p_Var1->working_state->stones[lVar7]->attrs != (attr_list)0x0) {
              free_attr_list();
            }
            p_Var6 = (attr_list)
                     attr_list_from_string((mmsg->u).flush_reconfig.attr_stone_list[lVar8].attr_str)
            ;
            p_Var1->working_state->stones[lVar7]->attrs = p_Var6;
            break;
          }
          lVar7 = lVar7 + 1;
        } while (p_Var1->stone_count != lVar7);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (mmsg->u).flush_reconfig.count);
  }
  if ((mmsg->u).flush_reconfig.reconfig != 0) {
    IntCManager_unlock(master->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                       ,0x4c2);
    (*master->node_reconfig_handler)(master->dfg);
    IntCManager_lock(master->cm,
                     "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                     ,0x4c4);
    master->reconfig = 1;
    master->sig_reconfig_bool = 1;
    check_all_nodes_registered(master);
  }
  return;
}

Assistant:

static void
handle_flush_reconfig(EVmaster master, EVmaster_msg_ptr mmsg)
{
    EVflush_attrs_reconfig_ptr msg = &mmsg->u.flush_reconfig;
    int i, j;
    EVdfg dfg = master->dfg;
    assert(CManager_locked(master->cm));
    if (((EVflush_attrs_reconfig_ptr)msg)->reconfig) {
	master->state = DFG_Reconfiguring;
    }
    CMtrace_out(master->cm, EVdfgVerbose, "EVDFG flush_attr_reconfig -  master DFG state is now %s\n", str_state[master->state]);
    for (i=0; i < msg->count; i++) {
	/* go through incoming attributes */
	for (j=0; j< dfg->stone_count; j++) {
	    if (dfg->deployed_state->stones[j]->stone_id == msg->attr_stone_list[i].stone) {
		if (dfg->deployed_state->stones[j]->attrs != NULL) {
		    free_attr_list(dfg->deployed_state->stones[j]->attrs);
		}
		dfg->deployed_state->stones[j]->attrs = attr_list_from_string(msg->attr_stone_list[i].attr_str);
		if (dfg->working_state->stones[j]->attrs != NULL) {
		    free_attr_list(dfg->working_state->stones[j]->attrs);
		}
		dfg->working_state->stones[j]->attrs = attr_list_from_string(msg->attr_stone_list[i].attr_str);
		break;
	    }
	}
    }
    if (msg->reconfig) {
	CManager_unlock(master->cm);
	master->node_reconfig_handler(master->dfg);
	CManager_lock(master->cm);
	master->reconfig = 1;
	master->sig_reconfig_bool = 1;
	check_all_nodes_registered(master);
    }
}